

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O3

RPCHelpMan * testmempoolaccept(void)

{
  size_type *psVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_13;
  string description_14;
  string description_15;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_12;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  RPCHelpMan *in_RDI;
  undefined8 uVar15;
  long lVar16;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  undefined4 in_stack_ffffffffffffea18;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffea1c;
  undefined1 *puVar18;
  undefined4 uVar19;
  undefined8 in_stack_ffffffffffffea28;
  undefined8 in_stack_ffffffffffffea30;
  undefined8 in_stack_ffffffffffffea38;
  code *pcVar20;
  undefined8 in_stack_ffffffffffffea40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffea48;
  pointer in_stack_ffffffffffffea58;
  pointer pRVar21;
  pointer in_stack_ffffffffffffea60;
  pointer pRVar22;
  pointer in_stack_ffffffffffffea68;
  pointer pRVar23;
  undefined8 in_stack_ffffffffffffea70;
  pointer in_stack_ffffffffffffea78;
  pointer pRVar24;
  pointer in_stack_ffffffffffffea80;
  pointer pRVar25;
  pointer in_stack_ffffffffffffea88;
  pointer pRVar26;
  pointer in_stack_ffffffffffffea90;
  pointer in_stack_ffffffffffffea98;
  pointer in_stack_ffffffffffffeaa0;
  pointer in_stack_ffffffffffffeaa8;
  pointer in_stack_ffffffffffffeab0;
  pointer in_stack_ffffffffffffeab8;
  undefined8 in_stack_ffffffffffffeac0;
  pointer in_stack_ffffffffffffeac8;
  pointer in_stack_ffffffffffffead0;
  pointer in_stack_ffffffffffffead8;
  _Vector_impl_data in_stack_ffffffffffffeae0;
  pointer in_stack_ffffffffffffeaf8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_14a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1488;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1468;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1450;
  RPCResults local_1438;
  allocator_type local_141a;
  allocator_type local_1419;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1418;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1400;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  ulong *local_11a8;
  undefined8 local_11a0;
  ulong local_1198;
  undefined8 uStack_1190;
  ulong *local_1188;
  size_type local_1180;
  ulong local_1178;
  undefined8 uStack_1170;
  long *local_1168 [2];
  long local_1158 [2];
  long *local_1148 [2];
  long local_1138 [2];
  long *local_1128 [2];
  long local_1118 [2];
  long *local_1108 [2];
  long local_10f8 [2];
  RPCResult local_10e8;
  long *local_1060 [2];
  long local_1050 [2];
  long *local_1040 [2];
  long local_1030 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  size_type *local_1000;
  size_type local_ff8;
  size_type local_ff0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  pointer local_fa0 [2];
  undefined1 local_f90 [152];
  RPCResult local_ef8;
  RPCResult local_e70;
  long *local_de8 [2];
  long local_dd8 [2];
  long *local_dc8 [2];
  long local_db8 [2];
  long *local_da8 [2];
  long local_d98 [2];
  long *local_d88 [2];
  long local_d78 [2];
  long *local_d68 [2];
  long local_d58 [2];
  long *local_d48 [2];
  long local_d38 [2];
  long *local_d28 [2];
  long local_d18 [2];
  long *local_d08 [2];
  long local_cf8 [2];
  long *local_ce8 [2];
  long local_cd8 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_cc8;
  long *local_ca8 [2];
  long local_c98 [2];
  pointer local_c88 [2];
  undefined1 local_c78 [152];
  RPCResult local_be0;
  RPCResult local_b58;
  RPCResult local_ad0;
  RPCResult local_a48;
  RPCResult local_9c0;
  RPCResult local_938;
  long *local_8b0 [2];
  long local_8a0 [2];
  long *local_890 [2];
  long local_880 [2];
  RPCResult local_870;
  long *local_7e8 [2];
  long local_7d8 [2];
  long *local_7c8 [2];
  long local_7b8 [2];
  RPCResult local_7a8;
  undefined1 local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined1 local_708;
  undefined7 uStack_707;
  undefined1 local_6f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  size_type *local_6b8;
  size_type local_6b0;
  size_type local_6a8;
  undefined8 uStack_6a0;
  string local_698;
  UniValue local_678;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_620;
  undefined1 local_5c8;
  long *local_5c0 [2];
  long local_5b0 [2];
  undefined1 local_5a0 [8];
  undefined1 *local_598;
  undefined8 local_590;
  undefined1 local_588;
  undefined7 uStack_587;
  undefined1 local_578 [32];
  undefined1 local_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined1 local_540;
  undefined7 uStack_53f;
  undefined1 local_530 [32];
  long *local_510 [2];
  long local_500 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4f0;
  undefined1 local_498;
  long *local_490 [2];
  long local_480 [2];
  undefined1 local_470 [216];
  undefined1 local_398 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  long *local_368 [2];
  long local_358 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_348;
  undefined1 local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  RPCArg local_2c8;
  RPCArg local_1c0;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_type *local_78;
  size_type local_70;
  size_type local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"testmempoolaccept","");
  util::ToString<unsigned_int>(&local_b8,&MAX_PACKAGE_COUNT);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_b8,0,0,
                       "\nReturns result of mempool acceptance tests indicating if raw transaction(s) (serialized, hex-encoded) would be accepted by mempool.\n\nIf multiple transactions are passed in, parents must come before children and package policies apply: the transactions cannot conflict with any mempool transactions or each other.\n\nIf one transaction fails, other transactions may not be fully validated (the \'allowed\' key will be blank).\n\nThe maximum number of transactions allowed is "
                       ,0x1d5);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if (paVar14 == paVar13) {
    local_98.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)paVar14;
  }
  local_98._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_98,
                       ".\n\nThis checks if transactions violate the consensus or policy rules.\n\nSee sendrawtransaction call.\n"
                      );
  local_78 = &local_68;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_68 = paVar14->_M_allocated_capacity;
    uStack_60 = *(undefined4 *)((long)&pbVar11->field_2 + 8);
    uStack_5c = *(undefined4 *)((long)&pbVar11->field_2 + 0xc);
  }
  else {
    local_68 = paVar14->_M_allocated_capacity;
    local_78 = psVar1;
  }
  local_70 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"rawtxs","");
  local_348._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2f0 = 0;
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"An array of hex strings of raw transactions.","");
  local_490[0] = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"rawtx","");
  local_4f0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_498 = 0;
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"");
  local_550 = &local_540;
  local_558 = 0;
  local_548 = 0;
  local_540 = 0;
  local_530._0_8_ = (pointer)0x0;
  local_530._8_2_ = 0;
  local_530._10_6_ = 0;
  local_530._16_2_ = 0;
  local_530._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffea1c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffea18;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  name.field_2._8_8_ = in_stack_ffffffffffffea30;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea40;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea38;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea48;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea58;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea60;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea68;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea70;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea78;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea80;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea88;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea90;
  description_13._M_string_length = (size_type)in_stack_ffffffffffffeaa0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea98;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeaa8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffeab0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeac0;
  opts._0_8_ = in_stack_ffffffffffffeab8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeac8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffead0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffead8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffeae0;
  opts._64_8_ = in_stack_ffffffffffffeaf8;
  RPCArg::RPCArg((RPCArg *)local_470,name,(Type)local_490,fallback,description_13,opts);
  __l._M_len = 1;
  __l._M_array = (iterator)local_470;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1418,__l,&local_1419);
  local_598 = &local_588;
  local_5a0[0] = 0;
  local_590 = 0;
  local_588 = 0;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_2_ = 0;
  local_578._10_6_ = 0;
  local_578._16_2_ = 0;
  local_578._18_8_ = 0;
  puVar18 = local_5a0;
  name_00._M_string_length = (size_type)in_RDI;
  name_00._M_dataplus._M_p = puVar18;
  name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  name_00.field_2._8_8_ = in_stack_ffffffffffffea30;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea40;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea38;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea48;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea58;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea60;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea68;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea70;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea78;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea80;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea88;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea90;
  description_14._M_string_length = (size_type)in_stack_ffffffffffffeaa0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea98;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeaa8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffeab0;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffeac0;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffeab8;
  inner_12.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffeac8;
  RPCArg::RPCArg(&local_2c8,name_00,(Type)&local_2e8,fallback_00,description_14,inner_12,
                 (RPCArgOptions *)0x1);
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"maxfeerate","");
  FormatMoney_abi_cxx11_(&local_698,node::DEFAULT_MAX_RAW_TX_FEE_RATE);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_678,&local_698);
  paVar14 = &local_678.val.field_2;
  local_620._8_8_ = (long)&local_620 + 0x18;
  local_620._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_678.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.val._M_dataplus._M_p == paVar14) {
    local_620._32_8_ = local_678.val.field_2._8_8_;
  }
  else {
    local_620._8_8_ = local_678.val._M_dataplus._M_p;
  }
  local_620._16_8_ = local_678.val._M_string_length;
  local_678.val._M_string_length = 0;
  local_678.val.field_2._M_local_buf[0] = '\0';
  local_620._40_8_ =
       local_678.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_620._48_8_ =
       local_678.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_620._56_8_ =
       local_678.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_678.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_620._64_8_ =
       local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_620._72_8_ =
       local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_620._80_8_ =
       local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_678.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c8 = 2;
  local_678.val._M_dataplus._M_p = (pointer)paVar14;
  std::operator+(&local_6d8,
                 "Reject transactions whose fee rate is higher than the specified value, expressed in "
                 ,&CURRENCY_UNIT_abi_cxx11_);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_6d8,
                       "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."
                      );
  local_6b8 = &local_6a8;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_6a8 = paVar14->_M_allocated_capacity;
    uStack_6a0 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_6a8 = paVar14->_M_allocated_capacity;
    local_6b8 = psVar1;
  }
  local_6b0 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_718 = &local_708;
  local_720 = 0;
  local_710 = 0;
  local_708 = 0;
  local_6f8._0_8_ = (pointer)0x0;
  local_6f8._8_2_ = 0;
  local_6f8._10_6_ = 0;
  local_6f8._16_2_ = 0;
  local_6f8._18_8_ = 0;
  name_01._M_string_length = (size_type)in_RDI;
  name_01._M_dataplus._M_p = puVar18;
  name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  name_01.field_2._8_8_ = in_stack_ffffffffffffea30;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffea40;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffea38;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_ffffffffffffea48;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffea58;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffea60;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffea68;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffea70;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffea78;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffea80;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffea88;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffea90;
  description_15._M_string_length = (size_type)in_stack_ffffffffffffeaa0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea98;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffeaa8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffeab0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeac0;
  opts_00._0_8_ = in_stack_ffffffffffffeab8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffeac8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffead0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffead8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_ffffffffffffeae0;
  opts_00._64_8_ = in_stack_ffffffffffffeaf8;
  RPCArg::RPCArg(&local_1c0,name_01,(Type)local_5c0,fallback_01,description_15,opts_00);
  __l_00._M_len = 2;
  __l_00._M_array = &local_2c8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1400,__l_00,&local_141a);
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"");
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,
             "The result of the mempool acceptance test for each raw transaction in the input array.\nReturns results for each transaction in the same order they were passed in.\nTransactions that cannot be fully validated due to failures in other transactions will not contain an \'allowed\' result.\n"
             ,"");
  local_890[0] = local_880;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_890,"");
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"");
  local_c88[0] = (pointer)local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"txid","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca8,"The transaction hash in hex","");
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name._M_dataplus._M_p = puVar18;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffea30;
  description._M_string_length = in_stack_ffffffffffffea40;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description.field_2 = in_stack_ffffffffffffea48;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffea60;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffea58;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            ((RPCResult *)(local_c78 + 0x10),STR_HEX,m_key_name,description,inner,SUB81(local_c88,0)
            );
  local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"wtxid","");
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce8,"The transaction witness hash in hex","");
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00._M_dataplus._M_p = puVar18;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffea30;
  description_00._M_string_length = in_stack_ffffffffffffea40;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_00.field_2 = in_stack_ffffffffffffea48;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult(&local_be0,STR_HEX,m_key_name_00,description_00,inner_00,SUB81(&local_cc8,0))
  ;
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"package-error","");
  uVar19 = (undefined4)((ulong)puVar18 >> 0x20);
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d28,
             "Package validation error, if any (only possible if rawtxs had more than 1 transaction)."
             ,"");
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = uVar19;
  auVar4._12_8_ = in_stack_ffffffffffffea28;
  auVar4._20_8_ = in_stack_ffffffffffffea30;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffea40;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_01.field_2 = in_stack_ffffffffffffea48;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_b58,STR,(string)(auVar4 << 0x20),SUB81(local_d08,0),description_01,inner_01,true
            );
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"allowed","");
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d68,
             "Whether this tx would be accepted to the mempool and pass client-specified maxfeerate. If not present, the tx was not fully validated due to a failure in another tx in the list."
             ,"");
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_14e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_8_ = in_RDI;
  auVar5._0_4_ = uVar19;
  auVar5._12_8_ = in_stack_ffffffffffffea28;
  auVar5._20_8_ = in_stack_ffffffffffffea30;
  auVar5._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffea40;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_02.field_2 = in_stack_ffffffffffffea48;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_ad0,BOOL,(string)(auVar5 << 0x20),SUB81(local_d48,0),description_02,inner_02,
             true);
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"vsize","");
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da8,
             "Virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted (only present when \'allowed\' is true)"
             ,"");
  uVar17 = 0;
  auVar6._4_8_ = in_RDI;
  auVar6._0_4_ = uVar19;
  auVar6._12_8_ = in_stack_ffffffffffffea28;
  auVar6._20_8_ = in_stack_ffffffffffffea30;
  auVar6._28_4_ = 0;
  description_03._M_string_length = in_stack_ffffffffffffea40;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_03.field_2 = in_stack_ffffffffffffea48;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_a48,NUM,(string)(auVar6 << 0x20),SUB81(local_d88,0),description_03,inner_03,true
            );
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"fees","");
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de8,"Transaction fees (only present if \'allowed\' is true)","");
  local_fa0[0] = (pointer)local_f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa0,"base","");
  std::operator+(&local_fc0,"transaction fee in ",&CURRENCY_UNIT_abi_cxx11_);
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar19;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar17;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffea30;
  description_04._M_string_length = in_stack_ffffffffffffea40;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_04.field_2 = in_stack_ffffffffffffea48;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            ((RPCResult *)(local_f90 + 0x10),STR_AMOUNT,m_key_name_01,description_04,inner_04,
             SUB81(local_fa0,0));
  local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"effective-feerate","");
  std::operator+(&local_1020,"the effective feerate in ",&CURRENCY_UNIT_abi_cxx11_);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1020,
                       " per KvB. May differ from the base feerate if, for example, there are modified fees from prioritisetransaction or a package feerate was used."
                      );
  local_1000 = local_ff0;
  psVar1 = (size_type *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar14) {
    local_ff0[0] = paVar14->_M_allocated_capacity;
    local_ff0[1] = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_ff0[0] = paVar14->_M_allocated_capacity;
    local_1000 = psVar1;
  }
  local_ff8 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  uVar17 = 0;
  auVar7._4_8_ = in_RDI;
  auVar7._0_4_ = uVar19;
  auVar7._12_8_ = in_stack_ffffffffffffea28;
  auVar7._20_8_ = in_stack_ffffffffffffea30;
  auVar7._28_4_ = 0;
  description_05._M_string_length = in_stack_ffffffffffffea40;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_05.field_2 = in_stack_ffffffffffffea48;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_ef8,STR_AMOUNT,(string)(auVar7 << 0x20),SUB81(&local_fe0,0),description_05,
             inner_05,false);
  local_1040[0] = local_1030;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1040,"effective-includes","");
  local_1060[0] = local_1050;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1060,
             "transactions whose fees and vsizes are included in effective-feerate.","");
  local_1108[0] = local_10f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1108,"");
  local_1128[0] = local_1118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1128,"transaction wtxid in hex","");
  pRVar24 = (pointer)0x0;
  pRVar25 = (pointer)0x0;
  pRVar26 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar19;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar17;
  m_key_name_02._M_string_length = (size_type)in_RDI;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffea30;
  description_06._M_string_length = in_stack_ffffffffffffea40;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_06.field_2 = in_stack_ffffffffffffea48;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_10e8,STR_HEX,m_key_name_02,description_06,inner_06,SUB81(local_1108,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_10e8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea90,__l_01,
             (allocator_type *)&stack0xffffffffffffea77);
  auVar8._4_8_ = in_RDI;
  auVar8._0_4_ = uVar19;
  auVar8._12_8_ = in_stack_ffffffffffffea28;
  auVar8._20_8_ = in_stack_ffffffffffffea30;
  auVar8._28_4_ = 0;
  description_07._M_string_length = in_stack_ffffffffffffea40;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_07.field_2 = in_stack_ffffffffffffea48;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_e70,ARR,(string)(auVar8 << 0x20),SUB81(local_1040,0),description_07,inner_07,
             false);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)(local_f90 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeae0,__l_02,
             (allocator_type *)&stack0xffffffffffffea76);
  auVar9._4_8_ = in_RDI;
  auVar9._0_4_ = uVar19;
  auVar9._12_8_ = in_stack_ffffffffffffea28;
  auVar9._20_8_ = in_stack_ffffffffffffea30;
  auVar9._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffea40;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_08.field_2 = in_stack_ffffffffffffea48;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffea60;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffea58;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffea68;
  RPCResult::RPCResult
            (&local_9c0,OBJ,(string)(auVar9 << 0x20),SUB81(local_dc8,0),description_08,inner_08,true
            );
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1148,"reject-reason","");
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1168,"Rejection string (only present when \'allowed\' is false)","");
  pRVar21 = (pointer)0x0;
  pRVar22 = (pointer)0x0;
  pRVar23 = (pointer)0x0;
  uVar17 = 0;
  auVar10._4_8_ = in_RDI;
  auVar10._0_4_ = uVar19;
  auVar10._12_8_ = in_stack_ffffffffffffea28;
  auVar10._20_8_ = in_stack_ffffffffffffea30;
  auVar10._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffea40;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_09.field_2._M_local_buf = in_stack_ffffffffffffea48._M_local_buf;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_938,STR,(string)(auVar10 << 0x20),SUB81(local_1148,0),description_09,inner_09,
             true);
  __l_03._M_len = 7;
  __l_03._M_array = (iterator)(local_c78 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1468,__l_03,(allocator_type *)&stack0xffffffffffffea57);
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar19;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar17;
  m_key_name_03._M_string_length = (size_type)in_RDI;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffea30;
  description_10._M_string_length = in_stack_ffffffffffffea40;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_10.field_2._M_local_buf = in_stack_ffffffffffffea48._M_local_buf;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar22;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar21;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar23;
  RPCResult::RPCResult(&local_870,OBJ,m_key_name_03,description_10,inner_10,SUB81(local_890,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_870;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1450,__l_04,(allocator_type *)&stack0xffffffffffffea56);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar19;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar17;
  m_key_name_04._M_string_length = (size_type)in_RDI;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffea28;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffea30;
  description_11._M_string_length = in_stack_ffffffffffffea40;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffea38;
  description_11.field_2 = in_stack_ffffffffffffea48;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar22;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar21;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar23;
  RPCResult::RPCResult(&local_7a8,ARR,m_key_name_04,description_11,inner_11,SUB81(local_7c8,0));
  result._4_4_ = uVar19;
  result.m_type = uVar17;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_ffffffffffffea28;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffea30;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffea38;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea40;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffea48;
  result._64_8_ = pRVar21;
  result.m_description._M_dataplus._M_p = (pointer)pRVar22;
  result.m_description._M_string_length = (size_type)pRVar23;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffea70;
  result.m_description.field_2._8_8_ = pRVar24;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar25;
  result.m_cond._M_string_length = (size_type)pRVar26;
  result.m_cond.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea90;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffea98;
  RPCResults::RPCResults(&local_1438,result);
  local_12a8._M_dataplus._M_p = (pointer)&local_12a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12a8,"createrawtransaction","");
  local_12c8._M_dataplus._M_p = (pointer)&local_12c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12c8,
             "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"","")
  ;
  HelpExampleCli(&local_1288,&local_12a8,&local_12c8);
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_1288,0,0,"\nCreate a transaction\n",0x16);
  local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar11->_M_dataplus)._M_p;
  paVar13 = &pbVar11->field_2;
  if (paVar14 == paVar13) {
    local_1268.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1268.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_1268.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_1268._M_dataplus._M_p = (pointer)paVar14;
  }
  local_1268._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1268,"Sign the transaction, and get back the hex\n");
  local_1248._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p == paVar14) {
    local_1248.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1248.field_2._8_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 8);
    local_1248.field_2._12_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 0xc);
    local_1248._M_dataplus._M_p = (pointer)&local_1248.field_2;
  }
  else {
    local_1248.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_1248._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_1308._M_dataplus._M_p = (pointer)&local_1308.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1308,"signrawtransactionwithwallet","");
  local_1328._M_dataplus._M_p = (pointer)&local_1328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1328,"\"myhex\"","");
  HelpExampleCli(&local_12e8,&local_1308,&local_1328);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
    uVar15 = local_1248.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_12e8._M_string_length + local_1248._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
      uVar15 = local_12e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_12e8._M_string_length + local_1248._M_string_length)
    goto LAB_009f9479;
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_12e8,0,0,local_1248._M_dataplus._M_p,local_1248._M_string_length);
  }
  else {
LAB_009f9479:
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1248,local_12e8._M_dataplus._M_p,local_12e8._M_string_length);
  }
  local_1228._M_dataplus._M_p = (pointer)&local_1228.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if (paVar13 == paVar14) {
    local_1228.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1228.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_1228.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1228._M_dataplus._M_p = (pointer)paVar13;
  }
  local_1228._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1228,"\nTest acceptance of the transaction (signed hex)\n");
  local_1208._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p == paVar14) {
    local_1208.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_1208.field_2._8_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 8);
    local_1208.field_2._12_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 0xc);
    local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  }
  else {
    local_1208.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_1208._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_1368._M_dataplus._M_p = (pointer)&local_1368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1368,"testmempoolaccept","");
  local_1388._M_dataplus._M_p = (pointer)&local_1388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1388,"\'[\"signedhex\"]\'","");
  HelpExampleCli(&local_1348,&local_1368,&local_1388);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    uVar15 = local_1208.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_1348._M_string_length + local_1208._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
      uVar15 = local_1348.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_1348._M_string_length + local_1208._M_string_length)
    goto LAB_009f9617;
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_1348,0,0,local_1208._M_dataplus._M_p,local_1208._M_string_length);
  }
  else {
LAB_009f9617:
    pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_1208,local_1348._M_dataplus._M_p,local_1348._M_string_length);
  }
  local_11e8._M_dataplus._M_p = (pointer)&local_11e8.field_2;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if (paVar13 == paVar14) {
    local_11e8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_11e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_11e8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_11e8._M_dataplus._M_p = (pointer)paVar13;
  }
  local_11e8._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_11e8,"\nAs a JSON-RPC call\n");
  local_11c8._M_dataplus._M_p = (pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p == paVar14) {
    local_11c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    local_11c8.field_2._8_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 8);
    local_11c8.field_2._12_4_ = *(undefined4 *)((long)&pbVar11->field_2 + 0xc);
    local_11c8._M_dataplus._M_p = (pointer)&local_11c8.field_2;
  }
  else {
    local_11c8.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
  }
  local_11c8._M_string_length = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  (pbVar11->field_2)._M_local_buf[0] = '\0';
  local_13c8._M_dataplus._M_p = (pointer)&local_13c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13c8,"testmempoolaccept","");
  local_13e8._M_dataplus._M_p = (pointer)&local_13e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13e8,"[\"signedhex\"]","");
  HelpExampleRpc(&local_13a8,&local_13c8,&local_13e8);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p != &local_11c8.field_2) {
    uVar15 = local_11c8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_13a8._M_string_length + local_11c8._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
      uVar15 = local_13a8.field_2._M_allocated_capacity;
    }
    if (local_13a8._M_string_length + local_11c8._M_string_length <= (ulong)uVar15) {
      pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_13a8,0,0,local_11c8._M_dataplus._M_p,local_11c8._M_string_length);
      goto LAB_009f97d5;
    }
  }
  pbVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_11c8,local_13a8._M_dataplus._M_p,local_13a8._M_string_length);
LAB_009f97d5:
  local_11a8 = &local_1198;
  puVar2 = (ulong *)(pbVar11->_M_dataplus)._M_p;
  paVar14 = &pbVar11->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar14) {
    local_1198 = paVar14->_M_allocated_capacity;
    uStack_1190 = *(undefined8 *)((long)&pbVar11->field_2 + 8);
  }
  else {
    local_1198 = paVar14->_M_allocated_capacity;
    local_11a8 = puVar2;
  }
  local_1180 = pbVar11->_M_string_length;
  (pbVar11->_M_dataplus)._M_p = (pointer)paVar14;
  pbVar11->_M_string_length = 0;
  paVar14->_M_local_buf[0] = '\0';
  if (local_11a8 == &local_1198) {
    uStack_1170 = uStack_1190;
    local_1188 = &local_1178;
  }
  else {
    local_1188 = local_11a8;
  }
  local_1178 = local_1198;
  local_11a0 = 0;
  local_1198 = local_1198 & 0xffffffffffffff00;
  pcVar20 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:160:9)>
            ::_M_manager;
  description_12._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:160:9)>
       ::_M_invoke;
  description_12._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mempool.cpp:160:9)>
                ::_M_manager;
  description_12.field_2 = in_stack_ffffffffffffea48;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar22;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar21;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar23;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar24;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffea70;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar25;
  examples.m_examples._M_string_length = (size_type)in_stack_ffffffffffffea90;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar26;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffea98;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffeaa0;
  local_11a8 = &local_1198;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xffffffffffffea28)),description_12,args,
             results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar20 != (code *)0x0) {
    (*pcVar20)(&stack0xffffffffffffea28,&stack0xffffffffffffea28,3);
  }
  if (local_1188 != &local_1178) {
    operator_delete(local_1188,local_1178 + 1);
  }
  if (local_11a8 != &local_1198) {
    operator_delete(local_11a8,local_1198 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13a8._M_dataplus._M_p != &local_13a8.field_2) {
    operator_delete(local_13a8._M_dataplus._M_p,local_13a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13e8._M_dataplus._M_p != &local_13e8.field_2) {
    operator_delete(local_13e8._M_dataplus._M_p,local_13e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13c8._M_dataplus._M_p != &local_13c8.field_2) {
    operator_delete(local_13c8._M_dataplus._M_p,local_13c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11c8._M_dataplus._M_p != &local_11c8.field_2) {
    operator_delete(local_11c8._M_dataplus._M_p,local_11c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11e8._M_dataplus._M_p != &local_11e8.field_2) {
    operator_delete(local_11e8._M_dataplus._M_p,local_11e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1348._M_dataplus._M_p != &local_1348.field_2) {
    operator_delete(local_1348._M_dataplus._M_p,local_1348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1388._M_dataplus._M_p != &local_1388.field_2) {
    operator_delete(local_1388._M_dataplus._M_p,local_1388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1368._M_dataplus._M_p != &local_1368.field_2) {
    operator_delete(local_1368._M_dataplus._M_p,local_1368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p != &local_1208.field_2) {
    operator_delete(local_1208._M_dataplus._M_p,local_1208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1228._M_dataplus._M_p != &local_1228.field_2) {
    operator_delete(local_1228._M_dataplus._M_p,local_1228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12e8._M_dataplus._M_p != &local_12e8.field_2) {
    operator_delete(local_12e8._M_dataplus._M_p,local_12e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1328._M_dataplus._M_p != &local_1328.field_2) {
    operator_delete(local_1328._M_dataplus._M_p,local_1328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1308._M_dataplus._M_p != &local_1308.field_2) {
    operator_delete(local_1308._M_dataplus._M_p,local_1308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248._M_dataplus._M_p != &local_1248.field_2) {
    operator_delete(local_1248._M_dataplus._M_p,local_1248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1268._M_dataplus._M_p != &local_1268.field_2) {
    operator_delete(local_1268._M_dataplus._M_p,local_1268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1288._M_dataplus._M_p != &local_1288.field_2) {
    operator_delete(local_1288._M_dataplus._M_p,local_1288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_dataplus._M_p != &local_12c8.field_2) {
    operator_delete(local_12c8._M_dataplus._M_p,local_12c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_dataplus._M_p != &local_12a8.field_2) {
    operator_delete(local_12a8._M_dataplus._M_p,local_12a8.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1438.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8.m_cond._M_dataplus._M_p != &local_7a8.m_cond.field_2) {
    operator_delete(local_7a8.m_cond._M_dataplus._M_p,
                    local_7a8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8.m_description._M_dataplus._M_p != &local_7a8.m_description.field_2) {
    operator_delete(local_7a8.m_description._M_dataplus._M_p,
                    local_7a8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_7a8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8.m_key_name._M_dataplus._M_p != &local_7a8.m_key_name.field_2) {
    operator_delete(local_7a8.m_key_name._M_dataplus._M_p,
                    local_7a8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_cond._M_dataplus._M_p != &local_870.m_cond.field_2) {
    operator_delete(local_870.m_cond._M_dataplus._M_p,
                    local_870.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_description._M_dataplus._M_p != &local_870.m_description.field_2) {
    operator_delete(local_870.m_description._M_dataplus._M_p,
                    local_870.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_870.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870.m_key_name._M_dataplus._M_p != &local_870.m_key_name.field_2) {
    operator_delete(local_870.m_key_name._M_dataplus._M_p,
                    local_870.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1468);
  lVar16 = 0x3b8;
  do {
    if ((long *)(local_c78 + lVar16) != *(long **)((long)local_c88 + lVar16)) {
      operator_delete(*(long **)((long)local_c88 + lVar16),*(long *)(local_c78 + lVar16) + 1);
    }
    if ((long *)((long)local_c98 + lVar16) != *(long **)((long)local_ca8 + lVar16)) {
      operator_delete(*(long **)((long)local_ca8 + lVar16),*(long *)((long)local_c98 + lVar16) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar16));
    if ((long *)((long)local_cd8 + lVar16) != *(long **)((long)local_ce8 + lVar16)) {
      operator_delete(*(long **)((long)local_ce8 + lVar16),*(long *)((long)local_cd8 + lVar16) + 1);
    }
    lVar16 = lVar16 + -0x88;
  } while (lVar16 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea58);
  if (local_1168[0] != local_1158) {
    operator_delete(local_1168[0],local_1158[0] + 1);
  }
  if (local_1148[0] != local_1138) {
    operator_delete(local_1148[0],local_1138[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeae0);
  lVar16 = 0x198;
  do {
    if ((long *)(local_f90 + lVar16) != *(long **)((long)local_fa0 + lVar16)) {
      operator_delete(*(long **)((long)local_fa0 + lVar16),*(long *)(local_f90 + lVar16) + 1);
    }
    plVar12 = (long *)((long)local_fa0 + lVar16 + -0x10);
    plVar3 = *(long **)((long)&local_fc0._M_dataplus._M_p + lVar16);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar16));
    if ((long *)((long)local_ff0 + lVar16) != *(long **)((long)&local_1000 + lVar16)) {
      operator_delete(*(long **)((long)&local_1000 + lVar16),*(long *)((long)local_ff0 + lVar16) + 1
                     );
    }
    lVar16 = lVar16 + -0x88;
  } while (lVar16 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8.m_cond._M_dataplus._M_p != &local_10e8.m_cond.field_2) {
    operator_delete(local_10e8.m_cond._M_dataplus._M_p,
                    local_10e8.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8.m_description._M_dataplus._M_p != &local_10e8.m_description.field_2) {
    operator_delete(local_10e8.m_description._M_dataplus._M_p,
                    local_10e8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10e8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10e8.m_key_name._M_dataplus._M_p != &local_10e8.m_key_name.field_2) {
    operator_delete(local_10e8.m_key_name._M_dataplus._M_p,
                    local_10e8.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffea78);
  if (local_1128[0] != local_1118) {
    operator_delete(local_1128[0],local_1118[0] + 1);
  }
  if (local_1108[0] != local_10f8) {
    operator_delete(local_1108[0],local_10f8[0] + 1);
  }
  if (local_1060[0] != local_1050) {
    operator_delete(local_1060[0],local_1050[0] + 1);
  }
  if (local_1040[0] != local_1030) {
    operator_delete(local_1040[0],local_1030[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeaa8);
  if (local_1000 != local_ff0) {
    operator_delete(local_1000,local_ff0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
    operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
  }
  if (local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_fe0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_fe0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeac8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc0._M_dataplus._M_p != &local_fc0.field_2) {
    operator_delete(local_fc0._M_dataplus._M_p,local_fc0.field_2._M_allocated_capacity + 1);
  }
  if (local_fa0[0] != (pointer)local_f90) {
    operator_delete(local_fa0[0],local_f90._0_8_ + 1);
  }
  if (local_de8[0] != local_dd8) {
    operator_delete(local_de8[0],local_dd8[0] + 1);
  }
  if (local_dc8[0] != local_db8) {
    operator_delete(local_dc8[0],local_db8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffeaf8);
  if (local_da8[0] != local_d98) {
    operator_delete(local_da8[0],local_d98[0] + 1);
  }
  if (local_d88[0] != local_d78) {
    operator_delete(local_d88[0],local_d78[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14e8);
  if (local_d68[0] != local_d58) {
    operator_delete(local_d68[0],local_d58[0] + 1);
  }
  if (local_d48[0] != local_d38) {
    operator_delete(local_d48[0],local_d38[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14c8);
  if (local_d28[0] != local_d18) {
    operator_delete(local_d28[0],local_d18[0] + 1);
  }
  if (local_d08[0] != local_cf8) {
    operator_delete(local_d08[0],local_cf8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_14a8);
  if (local_ce8[0] != local_cd8) {
    operator_delete(local_ce8[0],local_cd8[0] + 1);
  }
  if (local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_cc8.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1488);
  if (local_ca8[0] != local_c98) {
    operator_delete(local_ca8[0],local_c98[0] + 1);
  }
  if (local_c88[0] != (pointer)local_c78) {
    operator_delete(local_c88[0],local_c78._0_8_ + 1);
  }
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  if (local_890[0] != local_880) {
    operator_delete(local_890[0],local_880[0] + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1400);
  lVar16 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar16));
    plVar3 = *(long **)((long)&local_348 + lVar16 + 0x40);
    plVar12 = (long *)((long)&local_348 + lVar16 + 0x50);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    plVar12 = (long *)((long)&local_348 + lVar16 + 0x28);
    plVar3 = *(long **)((long)&local_348 + lVar16 + 0x18);
    if (plVar12 != plVar3) {
      operator_delete(plVar3,*plVar12 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(local_398 + lVar16 + 8));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_470 + lVar16 + 200));
    if ((long *)(local_470 + lVar16 + 0xb0) != *(long **)(local_470 + lVar16 + 0xa0)) {
      operator_delete(*(long **)(local_470 + lVar16 + 0xa0),*(long *)(local_470 + lVar16 + 0xb0) + 1
                     );
    }
    lVar16 = lVar16 + -0x108;
  } while (lVar16 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6f8);
  if (local_718 != &local_708) {
    operator_delete(local_718,CONCAT71(uStack_707,local_708) + 1);
  }
  if (local_6b8 != &local_6a8) {
    operator_delete(local_6b8,local_6a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_620._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_678.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_678.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.val._M_dataplus._M_p != &local_678.val.field_2) {
    operator_delete(local_678.val._M_dataplus._M_p,
                    CONCAT71(local_678.val.field_2._M_allocated_capacity._1_7_,
                             local_678.val.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_578);
  if (local_598 != &local_588) {
    operator_delete(local_598,CONCAT71(uStack_587,local_588) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_388);
  if ((undefined1 *)local_470._200_8_ != local_398) {
    operator_delete((void *)local_470._200_8_,local_398._0_8_ + 1);
  }
  if ((undefined1 *)local_470._160_8_ != local_470 + 0xb0) {
    operator_delete((void *)local_470._160_8_,local_470._176_8_ + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)(local_470 + 0x40));
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)(local_470 + 0x28));
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_530);
  if (local_550 != &local_540) {
    operator_delete(local_550,CONCAT71(uStack_53f,local_540) + 1);
  }
  if (local_510[0] != local_500) {
    operator_delete(local_510[0],local_500[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_4f0._M_first);
  if (local_490[0] != local_480) {
    operator_delete(local_490[0],local_480[0] + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_348._M_first);
  if (local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2e8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan testmempoolaccept()
{
    return RPCHelpMan{"testmempoolaccept",
        "\nReturns result of mempool acceptance tests indicating if raw transaction(s) (serialized, hex-encoded) would be accepted by mempool.\n"
        "\nIf multiple transactions are passed in, parents must come before children and package policies apply: the transactions cannot conflict with any mempool transactions or each other.\n"
        "\nIf one transaction fails, other transactions may not be fully validated (the 'allowed' key will be blank).\n"
        "\nThe maximum number of transactions allowed is " + ToString(MAX_PACKAGE_COUNT) + ".\n"
        "\nThis checks if transactions violate the consensus or policy rules.\n"
        "\nSee sendrawtransaction call.\n",
        {
            {"rawtxs", RPCArg::Type::ARR, RPCArg::Optional::NO, "An array of hex strings of raw transactions.",
                {
                    {"rawtx", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, ""},
                },
            },
            {"maxfeerate", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(DEFAULT_MAX_RAW_TX_FEE_RATE.GetFeePerK())},
             "Reject transactions whose fee rate is higher than the specified value, expressed in " + CURRENCY_UNIT +
                 "/kvB.\nFee rates larger than 1BTC/kvB are rejected.\nSet to 0 to accept any fee rate."},
        },
        RPCResult{
            RPCResult::Type::ARR, "", "The result of the mempool acceptance test for each raw transaction in the input array.\n"
                                      "Returns results for each transaction in the same order they were passed in.\n"
                                      "Transactions that cannot be fully validated due to failures in other transactions will not contain an 'allowed' result.\n",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {RPCResult::Type::STR_HEX, "txid", "The transaction hash in hex"},
                    {RPCResult::Type::STR_HEX, "wtxid", "The transaction witness hash in hex"},
                    {RPCResult::Type::STR, "package-error", /*optional=*/true, "Package validation error, if any (only possible if rawtxs had more than 1 transaction)."},
                    {RPCResult::Type::BOOL, "allowed", /*optional=*/true, "Whether this tx would be accepted to the mempool and pass client-specified maxfeerate. "
                                                       "If not present, the tx was not fully validated due to a failure in another tx in the list."},
                    {RPCResult::Type::NUM, "vsize", /*optional=*/true, "Virtual transaction size as defined in BIP 141. This is different from actual serialized size for witness transactions as witness data is discounted (only present when 'allowed' is true)"},
                    {RPCResult::Type::OBJ, "fees", /*optional=*/true, "Transaction fees (only present if 'allowed' is true)",
                    {
                        {RPCResult::Type::STR_AMOUNT, "base", "transaction fee in " + CURRENCY_UNIT},
                        {RPCResult::Type::STR_AMOUNT, "effective-feerate", /*optional=*/false, "the effective feerate in " + CURRENCY_UNIT + " per KvB. May differ from the base feerate if, for example, there are modified fees from prioritisetransaction or a package feerate was used."},
                        {RPCResult::Type::ARR, "effective-includes", /*optional=*/false, "transactions whose fees and vsizes are included in effective-feerate.",
                            {RPCResult{RPCResult::Type::STR_HEX, "", "transaction wtxid in hex"},
                        }},
                    }},
                    {RPCResult::Type::STR, "reject-reason", /*optional=*/true, "Rejection string (only present when 'allowed' is false)"},
                }},
            }
        },
        RPCExamples{
            "\nCreate a transaction\n"
            + HelpExampleCli("createrawtransaction", "\"[{\\\"txid\\\" : \\\"mytxid\\\",\\\"vout\\\":0}]\" \"{\\\"myaddress\\\":0.01}\"") +
            "Sign the transaction, and get back the hex\n"
            + HelpExampleCli("signrawtransactionwithwallet", "\"myhex\"") +
            "\nTest acceptance of the transaction (signed hex)\n"
            + HelpExampleCli("testmempoolaccept", R"('["signedhex"]')") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("testmempoolaccept", "[\"signedhex\"]")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const UniValue raw_transactions = request.params[0].get_array();
            if (raw_transactions.size() < 1 || raw_transactions.size() > MAX_PACKAGE_COUNT) {
                throw JSONRPCError(RPC_INVALID_PARAMETER,
                                   "Array must contain between 1 and " + ToString(MAX_PACKAGE_COUNT) + " transactions.");
            }

            const CFeeRate max_raw_tx_fee_rate{ParseFeeRate(self.Arg<UniValue>("maxfeerate"))};

            std::vector<CTransactionRef> txns;
            txns.reserve(raw_transactions.size());
            for (const auto& rawtx : raw_transactions.getValues()) {
                CMutableTransaction mtx;
                if (!DecodeHexTx(mtx, rawtx.get_str())) {
                    throw JSONRPCError(RPC_DESERIALIZATION_ERROR,
                                       "TX decode failed: " + rawtx.get_str() + " Make sure the tx has at least one input.");
                }
                txns.emplace_back(MakeTransactionRef(std::move(mtx)));
            }

            NodeContext& node = EnsureAnyNodeContext(request.context);
            CTxMemPool& mempool = EnsureMemPool(node);
            ChainstateManager& chainman = EnsureChainman(node);
            Chainstate& chainstate = chainman.ActiveChainstate();
            const PackageMempoolAcceptResult package_result = [&] {
                LOCK(::cs_main);
                if (txns.size() > 1) return ProcessNewPackage(chainstate, mempool, txns, /*test_accept=*/true, /*client_maxfeerate=*/{});
                return PackageMempoolAcceptResult(txns[0]->GetWitnessHash(),
                                                  chainman.ProcessTransaction(txns[0], /*test_accept=*/true));
            }();

            UniValue rpc_result(UniValue::VARR);
            // We will check transaction fees while we iterate through txns in order. If any transaction fee
            // exceeds maxfeerate, we will leave the rest of the validation results blank, because it
            // doesn't make sense to return a validation result for a transaction if its ancestor(s) would
            // not be submitted.
            bool exit_early{false};
            for (const auto& tx : txns) {
                UniValue result_inner(UniValue::VOBJ);
                result_inner.pushKV("txid", tx->GetHash().GetHex());
                result_inner.pushKV("wtxid", tx->GetWitnessHash().GetHex());
                if (package_result.m_state.GetResult() == PackageValidationResult::PCKG_POLICY) {
                    result_inner.pushKV("package-error", package_result.m_state.ToString());
                }
                auto it = package_result.m_tx_results.find(tx->GetWitnessHash());
                if (exit_early || it == package_result.m_tx_results.end()) {
                    // Validation unfinished. Just return the txid and wtxid.
                    rpc_result.push_back(std::move(result_inner));
                    continue;
                }
                const auto& tx_result = it->second;
                // Package testmempoolaccept doesn't allow transactions to already be in the mempool.
                CHECK_NONFATAL(tx_result.m_result_type != MempoolAcceptResult::ResultType::MEMPOOL_ENTRY);
                if (tx_result.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    const CAmount fee = tx_result.m_base_fees.value();
                    // Check that fee does not exceed maximum fee
                    const int64_t virtual_size = tx_result.m_vsize.value();
                    const CAmount max_raw_tx_fee = max_raw_tx_fee_rate.GetFee(virtual_size);
                    if (max_raw_tx_fee && fee > max_raw_tx_fee) {
                        result_inner.pushKV("allowed", false);
                        result_inner.pushKV("reject-reason", "max-fee-exceeded");
                        exit_early = true;
                    } else {
                        // Only return the fee and vsize if the transaction would pass ATMP.
                        // These can be used to calculate the feerate.
                        result_inner.pushKV("allowed", true);
                        result_inner.pushKV("vsize", virtual_size);
                        UniValue fees(UniValue::VOBJ);
                        fees.pushKV("base", ValueFromAmount(fee));
                        fees.pushKV("effective-feerate", ValueFromAmount(tx_result.m_effective_feerate.value().GetFeePerK()));
                        UniValue effective_includes_res(UniValue::VARR);
                        for (const auto& wtxid : tx_result.m_wtxids_fee_calculations.value()) {
                            effective_includes_res.push_back(wtxid.ToString());
                        }
                        fees.pushKV("effective-includes", std::move(effective_includes_res));
                        result_inner.pushKV("fees", std::move(fees));
                    }
                } else {
                    result_inner.pushKV("allowed", false);
                    const TxValidationState state = tx_result.m_state;
                    if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
                        result_inner.pushKV("reject-reason", "missing-inputs");
                    } else {
                        result_inner.pushKV("reject-reason", state.GetRejectReason());
                    }
                }
                rpc_result.push_back(std::move(result_inner));
            }
            return rpc_result;
        },
    };
}